

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_ostream.cpp
# Opt level: O3

raw_ostream * __thiscall llvm::raw_ostream::operator<<(raw_ostream *this,format_object_base *Fmt)

{
  uint *puVar1;
  uint uVar2;
  size_t in_RCX;
  char *pcVar3;
  char *N;
  bool bVar4;
  undefined1 local_c0 [8];
  SmallVector<char,_128U> V;
  
  pcVar3 = this->OutBufEnd + -(long)this->OutBufCur;
  N = (char *)0x7f;
  if ((char *)0x3 < pcVar3) {
    uVar2 = format_object_base::print(Fmt,this->OutBufCur,(uint)pcVar3);
    N = (char *)(ulong)uVar2;
    if (N <= pcVar3) {
      this->OutBufCur = this->OutBufCur + (long)N;
      return this;
    }
  }
  puVar1 = &V.super_SmallVectorImpl<char>.super_SmallVectorTemplateBase<char,_true>.
            super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size;
  V.super_SmallVectorImpl<char>.super_SmallVectorTemplateBase<char,_true>.
  super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX = (void *)0x8000000000;
  local_c0 = (undefined1  [8])puVar1;
  do {
    SmallVectorImpl<char>::resize((SmallVectorImpl<char> *)local_c0,(size_type)N);
    uVar2 = format_object_base::print(Fmt,(char *)local_c0,(uint)N);
    pcVar3 = (char *)(ulong)uVar2;
    bVar4 = N < pcVar3;
    N = pcVar3;
  } while (bVar4);
  write(this,local_c0._0_4_,pcVar3,in_RCX);
  if (local_c0 != (undefined1  [8])puVar1) {
    free((void *)local_c0);
  }
  return this;
}

Assistant:

raw_ostream &raw_ostream::operator<<(const format_object_base &Fmt) {
  // If we have more than a few bytes left in our output buffer, try
  // formatting directly onto its end.
  size_t NextBufferSize = 127;
  size_t BufferBytesLeft = OutBufEnd - OutBufCur;
  if (BufferBytesLeft > 3) {
    size_t BytesUsed = Fmt.print(OutBufCur, BufferBytesLeft);

    // Common case is that we have plenty of space.
    if (BytesUsed <= BufferBytesLeft) {
      OutBufCur += BytesUsed;
      return *this;
    }

    // Otherwise, we overflowed and the return value tells us the size to try
    // again with.
    NextBufferSize = BytesUsed;
  }

  // If we got here, we didn't have enough space in the output buffer for the
  // string.  Try printing into a SmallVector that is resized to have enough
  // space.  Iterate until we win.
  SmallVector<char, 128> V;

  while (true) {
    V.resize(NextBufferSize);

    // Try formatting into the SmallVector.
    size_t BytesUsed = Fmt.print(V.data(), NextBufferSize);

    // If BytesUsed fit into the vector, we win.
    if (BytesUsed <= NextBufferSize)
      return write(V.data(), BytesUsed);

    // Otherwise, try again with a new size.
    assert(BytesUsed > NextBufferSize && "Didn't grow buffer!?");
    NextBufferSize = BytesUsed;
  }
}